

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_function.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundFunctionExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  bool bVar1;
  DataChunk *this_00;
  size_type sVar2;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RCX;
  long in_RDX;
  BoundFunctionExpression *in_RSI;
  idx_t in_R8;
  Vector *in_R9;
  idx_t i;
  DataChunk *arguments;
  Expression *in_stack_00000078;
  ExpressionExecutor *in_stack_00000080;
  Vector *in_stack_ffffffffffffff88;
  ExpressionState *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffffa0;
  ulong local_40;
  
  DataChunk::Reset((DataChunk *)in_RSI);
  this_00 = (DataChunk *)(in_RDX + 0x48);
  bVar1 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::empty
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     in_stack_ffffffffffffffa0);
  if (!bVar1) {
    for (local_40 = 0;
        sVar2 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)&in_RSI->children), local_40 < sVar2; local_40 = local_40 + 1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff90 =
           (ExpressionState *)
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff90);
      vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                    *)in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff98 =
           ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
           ::get((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffa0 = in_RCX;
      vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff90,
                 (size_type)in_stack_ffffffffffffff88);
      Execute(in_stack_00000080,in_stack_00000078,(ExpressionState *)this,(SelectionVector *)expr,
              (idx_t)state,(Vector *)sel);
    }
  }
  DataChunk::SetCardinality(this_00,in_R8);
  DataChunk::Verify(this_00);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator()(in_stack_ffffffffffffffa0,(DataChunk *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  VerifyNullHandling(in_RSI,this_00,in_R9);
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundFunctionExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	state->intermediate_chunk.Reset();
	auto &arguments = state->intermediate_chunk;
	if (!state->types.empty()) {
		for (idx_t i = 0; i < expr.children.size(); i++) {
			D_ASSERT(state->types[i] == expr.children[i]->return_type);
			Execute(*expr.children[i], state->child_states[i].get(), sel, count, arguments.data[i]);
#ifdef DEBUG
			if (expr.children[i]->return_type.id() == LogicalTypeId::VARCHAR) {
				arguments.data[i].UTFVerify(count);
			}
#endif
		}
	}
	arguments.SetCardinality(count);
	arguments.Verify();

	D_ASSERT(expr.function.function);
	// #ifdef DEBUG
	expr.function.function(arguments, *state, result);

	VerifyNullHandling(expr, arguments, result);
	D_ASSERT(result.GetType() == expr.return_type);
}